

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DisableIffAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::DisableIffAssertionExpr,slang::ast::Expression_const&,slang::ast::AssertionExpr_const&>
          (BumpAllocator *this,Expression *args,AssertionExpr *args_1)

{
  DisableIffAssertionExpr *expr;
  Expression *in_RDX;
  DisableIffAssertionExpr *in_RSI;
  BumpAllocator *in_RDI;
  
  expr = (DisableIffAssertionExpr *)allocate(in_RDI,(size_t)in_RSI,(size_t)in_RDX);
  ast::DisableIffAssertionExpr::DisableIffAssertionExpr(in_RSI,in_RDX,(AssertionExpr *)expr);
  return expr;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }